

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstyle.cpp
# Opt level: O2

void __thiscall
QStyle::drawItemPixmap(QStyle *this,QPainter *painter,QRect *rect,int alignment,QPixmap *pixmap)

{
  LayoutDirection direction;
  int x;
  int y;
  long in_FS_OFFSET;
  qreal c;
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  QSize local_50;
  QSize local_48;
  QRect local_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  c = (qreal)QPixmap::devicePixelRatio();
  direction = QGuiApplication::layoutDirection();
  local_50 = (QSize)QPixmap::size();
  local_48 = operator/(&local_50,c);
  local_40 = alignedRect(direction,(Alignment)alignment,&local_48,rect);
  auVar3 = QRect::operator&(&local_40,rect);
  x = auVar3._0_4_;
  y = auVar3._4_4_;
  dVar1 = (double)((auVar3._8_4_ - x) + 1) * c;
  dVar2 = (double)((auVar3._12_4_ - y) + 1) * c;
  QPainter::drawPixmap
            (painter,x,y,pixmap,x - local_40.x1.m_i,y - local_40.y1.m_i,
             (int)((double)((ulong)dVar1 & 0x8000000000000000 | 0x3fe0000000000000) + dVar1),
             (int)((double)((ulong)dVar2 & 0x8000000000000000 | 0x3fe0000000000000) + dVar2));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QStyle::drawItemPixmap(QPainter *painter, const QRect &rect, int alignment,
                            const QPixmap &pixmap) const
{
    qreal scale = pixmap.devicePixelRatio();
    QRect aligned = alignedRect(QGuiApplication::layoutDirection(), QFlag(alignment), pixmap.size() / scale, rect);
    QRect inter = aligned.intersected(rect);

    painter->drawPixmap(inter.x(), inter.y(), pixmap, inter.x() - aligned.x(), inter.y() - aligned.y(), qRound(inter.width() * scale), qRound(inter.height() *scale));
}